

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

Variable __thiscall
runtime::VirtualMachine::loadClosureValue(VirtualMachine *this,Function *fn,size_t index)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  Variable VVar4;
  allocator<char> local_99;
  string local_98;
  const_reference local_78;
  value_type *closure;
  allocator<char> local_59;
  string local_58;
  Function *local_38;
  vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_> *closures;
  size_t index_local;
  Function *fn_local;
  VirtualMachine *this_local;
  
  local_38 = fn;
  closures = (vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_> *)index;
  index_local = (size_t)fn;
  fn_local = (Function *)this;
  sVar2 = std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::size
                    (&fn->captures);
  if (sVar2 <= index) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Index out of bounds in loadClosureValue",&local_59);
    panic(this,&local_58);
  }
  local_78 = std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::at
                       (&local_38->captures,(size_type)closures);
  uVar1 = local_78->scopeIndex;
  sVar2 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size
                    (&local_78->stackFrame->locals);
  if (sVar2 <= uVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Scope index >= closure.stackFrame->locals.size()",&local_99);
    panic(this,&local_98);
  }
  pvVar3 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                     (&local_78->stackFrame->locals,local_78->scopeIndex);
  VVar4._0_8_ = *(ulong *)pvVar3 & 0xffffffff;
  VVar4.field_1.integerValue = (pvVar3->field_1).integerValue;
  return VVar4;
}

Assistant:

runtime::Variable runtime::VirtualMachine::loadClosureValue(const runtime::Function* fn, std::size_t index) {
  auto& closures = fn->captures;

  if (index >= closures.size()) {
    this->panic("Index out of bounds in loadClosureValue");
  }

  const auto& closure = closures.at(index);

  if (closure.scopeIndex >= closure.stackFrame->locals.size()) {
    this->panic("Scope index >= closure.stackFrame->locals.size()");
  }

  return closure.stackFrame->locals.at(closure.scopeIndex);
}